

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O3

void __thiscall Assimp::Discreet3DSImporter::ParseEditorChunk(Discreet3DSImporter *this)

{
  char *pcVar1;
  StreamReader<false,_false> *this_00;
  short sVar2;
  uint uVar3;
  Logger *this_01;
  size_t sVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  bool bVar8;
  int iVar9;
  bool bVar10;
  bool bVar11;
  Chunk chunk;
  char buff [10];
  Chunk local_1f8;
  char local_1f2;
  char local_1f1 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  char *local_1c8;
  char local_1b8 [16];
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> local_1a8 [112];
  ios_base local_138 [264];
  
  if (5 < (uint)(*(int *)&this->stream->limit - *(int *)&this->stream->current)) {
    do {
      ReadChunk(this,&local_1f8);
      if ((int)(local_1f8.Size - 6) < 1) {
        uVar3 = (int)this->stream->limit - (int)this->stream->current;
      }
      else {
        this_00 = this->stream;
        uVar3 = StreamReader<false,_false>::SetReadLimit
                          (this_00,(local_1f8.Size - 6) +
                                   (*(int *)&this_00->current - *(int *)&this_00->buffer));
        if (local_1f8.Flag == 2) {
          sVar2 = StreamReader<false,_false>::Get<short>(this->stream);
          iVar5 = (int)sVar2;
          uVar6 = 1;
          if (sVar2 < 0) {
            local_1f2 = '-';
            iVar5 = -iVar5;
            uVar6 = 2;
            pcVar7 = local_1f1;
          }
          else {
            pcVar7 = &local_1f2;
          }
          iVar9 = 1000000000;
          bVar8 = false;
          do {
            bVar10 = (int)((long)iVar5 / (long)iVar9) != 0;
            bVar11 = iVar9 == 1;
            if ((bVar8 || bVar11) || bVar10) {
              pcVar1 = pcVar7 + 1;
              *pcVar7 = (char)((long)iVar5 / (long)iVar9) + '0';
              pcVar7 = pcVar1;
              if (iVar9 == 1) break;
              uVar6 = uVar6 + 1;
              iVar5 = iVar5 % iVar9;
            }
            iVar9 = iVar9 / 10;
            bVar8 = (bool)(bVar8 | bVar11 | bVar10);
          } while (uVar6 < 10);
          *pcVar7 = '\0';
          this_01 = DefaultLogger::get();
          local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1e8,"3DS file format version: ","");
          Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
          basic_formatter<std::__cxx11::string>(local_1a8,&local_1e8);
          sVar4 = strlen(&local_1f2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1f2,sVar4);
          std::__cxx11::stringbuf::str();
          Logger::info(this_01,local_1c8);
          if (local_1c8 != local_1b8) {
            operator_delete(local_1c8);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
            operator_delete(local_1e8._M_dataplus._M_p);
          }
        }
        else if (local_1f8.Flag == 0xb000) {
          ParseKeyframeChunk(this);
        }
        else if (local_1f8.Flag == 0x3d3d) {
          ParseObjectChunk(this);
        }
        this->stream->current = this->stream->limit;
        StreamReader<false,_false>::SetReadLimit(this->stream,uVar3);
        uVar3 = (int)this->stream->limit - (int)this->stream->current;
        if (uVar3 == 0) {
          return;
        }
      }
    } while (5 < uVar3);
  }
  return;
}

Assistant:

void Discreet3DSImporter::ParseEditorChunk()
{
    ASSIMP_3DS_BEGIN_CHUNK();

    // get chunk type
    switch (chunk.Flag)
    {
    case Discreet3DS::CHUNK_OBJMESH:

        ParseObjectChunk();
        break;

    // NOTE: In several documentations in the internet this
    // chunk appears at different locations
    case Discreet3DS::CHUNK_KEYFRAMER:

        ParseKeyframeChunk();
        break;

    case Discreet3DS::CHUNK_VERSION:
        {
        // print the version number
        char buff[10];
        ASSIMP_itoa10(buff,stream->GetI2());
        ASSIMP_LOG_INFO_F(std::string("3DS file format version: "), buff);
        }
        break;
    };
    ASSIMP_3DS_END_CHUNK();
}